

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

StatusOr<google::protobuf::FeatureSet> *
google::protobuf::internal::GetEditionFeatureSetDefaults
          (StatusOr<google::protobuf::FeatureSet> *__return_storage_ptr__,Edition edition,
          FeatureSetDefaults *defaults)

{
  void **ppvVar1;
  const_iterator cVar2;
  ulong uVar3;
  void **ppvVar4;
  ulong uVar5;
  undefined1 *puVar6;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this;
  string_view message;
  FeatureSet features;
  FeatureSetEditionDefault search;
  Status local_120;
  Edition local_114;
  string local_110;
  StringifySink local_f0;
  FeatureSet local_d0;
  FeatureSetDefaults_FeatureSetEditionDefault local_80;
  AlphaNum local_50;
  
  FeatureSetDefaults_FeatureSetEditionDefault::FeatureSetDefaults_FeatureSetEditionDefault
            (&local_80);
  FeatureSetDefaults_FeatureSetEditionDefault::set_edition(&local_80,edition);
  this = &(defaults->field_0)._impl_.defaults_;
  ppvVar1 = RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
  cVar2 = RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>::end(this)
  ;
  uVar5 = (long)cVar2.it_ - (long)ppvVar1 >> 3;
  while (uVar3 = uVar5, 0 < (long)uVar3) {
    uVar5 = uVar3 >> 1;
    if (*(int *)((long)ppvVar1[uVar5] + 0x28) <= local_80.field_0._impl_.edition_) {
      ppvVar1 = ppvVar1 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar3;
    }
  }
  ppvVar4 = RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
  if (ppvVar1 == ppvVar4) {
    local_114 = edition;
    local_d0.super_Message.super_MessageLite =
         (MessageLite)absl::lts_20250127::NullSafeStringView("No valid default found for edition ");
    local_f0.buffer_._M_dataplus._M_p = (pointer)&local_f0.buffer_.field_2;
    local_f0.buffer_.field_2._M_allocated_capacity = 0;
    local_f0.buffer_.field_2._8_8_ = 0;
    local_f0.buffer_._M_string_length = 0;
    local_50.piece_ =
         absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                   (&local_f0,&local_114);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_110,(lts_20250127 *)&local_d0,&local_50,&local_50);
    message._M_str = (char *)local_110._M_string_length;
    message._M_len = (size_t)&local_120;
    absl::lts_20250127::FailedPreconditionError(message);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
    StatusOrData<absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSet>,&local_120)
    ;
    absl::lts_20250127::Status::~Status(&local_120);
  }
  else {
    puVar6 = *(undefined1 **)((long)ppvVar1[-1] + 0x20);
    if ((FeatureSet *)puVar6 == (FeatureSet *)0x0) {
      puVar6 = _FeatureSet_default_instance_;
    }
    FeatureSet::FeatureSet(&local_d0,(FeatureSet *)puVar6);
    puVar6 = *(undefined1 **)((long)ppvVar1[-1] + 0x18);
    if ((MessageLite *)puVar6 == (MessageLite *)0x0) {
      puVar6 = _FeatureSet_default_instance_;
    }
    FeatureSet::MergeImpl((MessageLite *)&local_d0,(MessageLite *)puVar6);
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
    StatusOrData<google::protobuf::FeatureSet>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSet>,&local_d0);
    FeatureSet::~FeatureSet(&local_d0);
  }
  FeatureSetDefaults_FeatureSetEditionDefault::~FeatureSetDefaults_FeatureSetEditionDefault
            (&local_80);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSet> GetEditionFeatureSetDefaults(
    Edition edition, const FeatureSetDefaults& defaults) {
  // Select the matching edition defaults.
  auto comparator = [](const auto& a, const auto& b) {
    return a.edition() < b.edition();
  };
  FeatureSetDefaults::FeatureSetEditionDefault search;
  search.set_edition(edition);
  auto first_nonmatch =
      absl::c_upper_bound(defaults.defaults(), search, comparator);
  if (first_nonmatch == defaults.defaults().begin()) {
    return Error("No valid default found for edition ", edition);
  }
  FeatureSet features = std::prev(first_nonmatch)->fixed_features();
  features.MergeFrom(std::prev(first_nonmatch)->overridable_features());
  return features;
}